

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O1

char * ngx_http_upstream_init_main_conf(ngx_conf_t *cf,void *conf)

{
  ngx_http_upstream_header_t *pnVar1;
  long lVar2;
  u_char *puVar3;
  code *pcVar4;
  long lVar5;
  size_t *psVar6;
  ngx_uint_t nVar7;
  ngx_int_t nVar8;
  char *pcVar9;
  ulong uVar10;
  ngx_http_upstream_header_t *pnVar11;
  undefined1 local_90 [8];
  ngx_hash_init_t hash;
  ngx_array_t headers_in;
  
  if (*(long *)((long)conf + 0x18) != 0) {
    lVar2 = *(long *)((long)conf + 0x10);
    uVar10 = 0;
    do {
      pcVar4 = (code *)**(long **)(lVar2 + uVar10 * 8);
      if (pcVar4 == (code *)0x0) {
        pcVar4 = ngx_http_upstream_init_round_robin;
      }
      lVar5 = (*pcVar4)(cf);
      if (lVar5 != 0) {
        return (char *)0xffffffffffffffff;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(ulong *)((long)conf + 0x18));
  }
  hash.temp_pool = (ngx_pool_t *)ngx_palloc(cf->temp_pool,0x400);
  pcVar9 = (char *)0xffffffffffffffff;
  if (hash.temp_pool != (ngx_pool_t *)0x0) {
    if (ngx_http_upstream_headers_in[0].name.len != 0) {
      pnVar11 = ngx_http_upstream_headers_in;
      do {
        psVar6 = (size_t *)ngx_array_push((ngx_array_t *)&hash.temp_pool);
        if (psVar6 == (size_t *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        puVar3 = (pnVar11->name).data;
        *psVar6 = (pnVar11->name).len;
        psVar6[1] = (size_t)puVar3;
        nVar7 = ngx_hash_key_lc((pnVar11->name).data,(pnVar11->name).len);
        psVar6[2] = nVar7;
        psVar6[3] = (size_t)pnVar11;
        pnVar1 = pnVar11 + 1;
        pnVar11 = pnVar11 + 1;
      } while ((pnVar1->name).len != 0);
    }
    hash.hash = (ngx_hash_t *)ngx_hash_key_lc;
    hash.key = (ngx_hash_key_pt)0x200;
    hash.max_size = -ngx_cacheline_size & ngx_cacheline_size + 0x3f;
    hash.bucket_size = (ngx_uint_t)anon_var_dwarf_7c7a3;
    hash.name = (char *)cf->pool;
    hash.pool = (ngx_pool_t *)0x0;
    local_90 = (undefined1  [8])conf;
    nVar8 = ngx_hash_init((ngx_hash_init_t *)local_90,(ngx_hash_key_t *)hash.temp_pool,0);
    pcVar9 = (char *)-(ulong)(nVar8 != 0);
  }
  return pcVar9;
}

Assistant:

static char *
ngx_http_upstream_init_main_conf(ngx_conf_t *cf, void *conf)
{
    ngx_http_upstream_main_conf_t  *umcf = conf;

    ngx_uint_t                      i;
    ngx_array_t                     headers_in;
    ngx_hash_key_t                 *hk;
    ngx_hash_init_t                 hash;
    ngx_http_upstream_init_pt       init;
    ngx_http_upstream_header_t     *header;
    ngx_http_upstream_srv_conf_t  **uscfp;

    uscfp = umcf->upstreams.elts;

    for (i = 0; i < umcf->upstreams.nelts; i++) {

        init = uscfp[i]->peer.init_upstream ? uscfp[i]->peer.init_upstream:
                                            ngx_http_upstream_init_round_robin;

        if (init(cf, uscfp[i]) != NGX_OK) {
            return NGX_CONF_ERROR;
        }
    }


    /* upstream_headers_in_hash */

    if (ngx_array_init(&headers_in, cf->temp_pool, 32, sizeof(ngx_hash_key_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    for (header = ngx_http_upstream_headers_in; header->name.len; header++) {
        hk = ngx_array_push(&headers_in);
        if (hk == NULL) {
            return NGX_CONF_ERROR;
        }

        hk->key = header->name;
        hk->key_hash = ngx_hash_key_lc(header->name.data, header->name.len);
        hk->value = header;
    }

    hash.hash = &umcf->headers_in_hash;
    hash.key = ngx_hash_key_lc;
    hash.max_size = 512;
    hash.bucket_size = ngx_align(64, ngx_cacheline_size);
    hash.name = "upstream_headers_in_hash";
    hash.pool = cf->pool;
    hash.temp_pool = NULL;

    if (ngx_hash_init(&hash, headers_in.elts, headers_in.nelts) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}